

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O0

value_type_conflict1 __thiscall
CCDPP::rank_one_update
          (CCDPP *this,SparseMatrix *_R,value_type_conflict1 *to_update,
          value_type_conflict1 *the_other,int workload)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this_00;
  reference pdVar2;
  function0<void> *in_RSI;
  anon_class_48_6_86eabbbe_for__M_f *in_RDI;
  double value;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 result;
  int thread_index;
  vector<double,_std::allocator<double>_> fun_dec;
  task_type *in_stack_fffffffffffffec8;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_fffffffffffffed0;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_100;
  undefined1 *local_f8;
  undefined8 in_stack_ffffffffffffff10;
  double dVar3;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:98:45)_(int)>
  *f;
  function0<void> *this_01;
  int local_60;
  undefined1 local_49;
  undefined8 local_48;
  undefined1 local_40 [28];
  function0<void> *local_10;
  
  this_00 = (vector<double,_std::allocator<double>_> *)
            (long)*(int *)((long)&in_RDI->_R->csr_rating_scores + 4);
  local_48 = 0;
  __n = &local_49;
  local_10 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x192797);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffef0,(size_type)__n,(value_type_conflict1 *)this_00,
             (allocator_type *)in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x1927c5);
  for (local_60 = 0; local_60 < *(int *)((long)&in_RDI->_R->csr_rating_scores + 4);
      local_60 = local_60 + 1) {
    in_stack_fffffffffffffed0 =
         (thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)in_RDI->to_update;
    f = (_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:98:45)_(int)>
         *)&stack0xffffffffffffffdc;
    this_01 = local_10;
    std::bind<CCDPP::rank_one_update(SparseMatrix&,double*,double*,int)::_lambda(int)_1_,int&>
              (in_RDI,(int *)in_stack_fffffffffffffed0);
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:98:45)_(int)>_>
              (this_01,f,(type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    boost::function0<void>::~function0((function0<void> *)0x192893);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)in_RDI->to_update,(void *)0x0);
  dVar3 = 0.0;
  local_f8 = local_40;
  local_100._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffed0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffec8);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_100);
    dVar3 = *pdVar2 + dVar3;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_100);
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return dVar3;
}

Assistant:

inline value_type rank_one_update(SparseMatrix &_R, value_type *to_update, value_type *the_other, const int workload) {

        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, _R.num_of_cols);

                value_type prev_value;

                for (int col = start; col < end; col++) {
                    // empty column
                    if (_R.ccs_col_ptr[col + 1] == _R.ccs_col_ptr[col]) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * (_R.ccs_col_ptr[col + 1] -
                                                                  _R.ccs_col_ptr[col]);

                    for (int idx = _R.ccs_col_ptr[col]; idx < _R.ccs_col_ptr[col + 1]; idx++) {
                        int i = _R.ccs_row_idx[idx];
                        numerator += the_other[i] * _R.ccs_rating_scores[idx];
                        denominator += the_other[i] * the_other[i];
                    }

                    prev_value = to_update[col];
                    to_update[col] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[col]);
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }